

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O2

void update_enabled_arrays(void)

{
  uint8 uVar1;
  MOJOSHADER_glContext *pMVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  uVar4 = 0;
  pMVar2 = ctx;
  while ((long)uVar3 < (long)pMVar2->max_attrs) {
    uVar1 = pMVar2->want_attr[uVar3];
    if (uVar1 != pMVar2->have_attr[uVar3]) {
      (*(&pMVar2->glDisableVertexAttribArray)[uVar1 != '\0'])((GLuint)uVar3);
      pMVar2 = ctx;
      ctx->have_attr[uVar3] = uVar1;
    }
    uVar3 = uVar3 + 1;
    if (uVar1 != '\0') {
      uVar4 = uVar3 & 0xffffffff;
    }
  }
  pMVar2->max_attrs = (GLint)uVar4;
  return;
}

Assistant:

static void update_enabled_arrays(void)
{
    int highest_enabled = 0;
    int i;

    // Enable/disable vertex arrays to match our needs.
    // this happens to work in both ARB1 and GLSL, but if something alien
    //  shows up, we'll have to split these into profile*() functions.
    for (i = 0; i < ctx->max_attrs; i++)
    {
        const int want = (const int) ctx->want_attr[i];
        const int have = (const int) ctx->have_attr[i];
        if (want != have)
        {
            if (want)
                ctx->glEnableVertexAttribArray(i);
            else
                ctx->glDisableVertexAttribArray(i);
            ctx->have_attr[i] = want;
        } // if

        if (want)
            highest_enabled = i + 1;
    } // for

    ctx->max_attrs = highest_enabled;  // trim unneeded iterations next time.
}